

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_base.hpp
# Opt level: O2

void boost::detail::function::
     functor_manager<boost::algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>_>
     ::manage(function_buffer *in_buffer,function_buffer *out_buffer,
             functor_manager_operation_type op)

{
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *ptVar1;
  is_any_ofF<char> *this;
  int iVar2;
  token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *this_00;
  void *pvVar3;
  
  if (op != get_functor_type_tag) {
    switch(op) {
    case clone_functor_tag:
      ptVar1 = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)(in_buffer->type).type;
      this_00 = (token_finderF<boost::algorithm::detail::is_any_ofF<char>_> *)operator_new(0x20);
      algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>_>::token_finderF
                (this_00,ptVar1);
      (out_buffer->type).type = (sp_typeinfo *)this_00;
      break;
    case move_functor_tag:
      out_buffer->obj_ptr = in_buffer->obj_ptr;
      in_buffer->obj_ptr = (void *)0x0;
      break;
    case destroy_functor_tag:
      this = (is_any_ofF<char> *)(out_buffer->type).type;
      if (this != (is_any_ofF<char> *)0x0) {
        algorithm::detail::is_any_ofF<char>::~is_any_ofF(this);
      }
      operator_delete(this);
      out_buffer->obj_ptr = (void *)0x0;
      break;
    case check_functor_type_tag:
      iVar2 = strcmp(*(char **)(out_buffer->func_ptr + 8) +
                     (**(char **)(out_buffer->func_ptr + 8) == '*'),
                     "N5boost9algorithm6detail13token_finderFINS1_10is_any_ofFIcEEEE");
      if (iVar2 == 0) {
        pvVar3 = in_buffer->obj_ptr;
      }
      else {
        pvVar3 = (void *)0x0;
      }
      out_buffer->obj_ptr = pvVar3;
      break;
    default:
      out_buffer->obj_ptr =
           &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
      *(bool *)((long)out_buffer + 8) = false;
      *(bool *)((long)out_buffer + 9) = false;
    }
    return;
  }
  out_buffer->obj_ptr =
       &algorithm::detail::token_finderF<boost::algorithm::detail::is_any_ofF<char>>::typeinfo;
  *(bool *)((long)out_buffer + 8) = false;
  *(bool *)((long)out_buffer + 9) = false;
  return;
}

Assistant:

static inline void
        manage(const function_buffer& in_buffer, function_buffer& out_buffer, 
               functor_manager_operation_type op)
        {
          typedef typename get_function_tag<functor_type>::type tag_type;
          switch (op) {
          case get_functor_type_tag:
            out_buffer.type.type = &BOOST_SP_TYPEID(functor_type);
            out_buffer.type.const_qualified = false;
            out_buffer.type.volatile_qualified = false;
            return;

          default:
            manager(in_buffer, out_buffer, op, tag_type());
            return;
          }
        }